

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

ParseArgumentStatus __thiscall
google::protobuf::compiler::CommandLineInterface::ParseArguments
          (CommandLineInterface *this,int argc,char **argv)

{
  _Rb_tree_node_base *__k;
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  __type _Var4;
  ParseArgumentStatus PVar5;
  ostream *poVar6;
  iterator iVar7;
  _Rb_tree_node_base *p_Var8;
  size_type sVar9;
  ulong uVar10;
  char *pcVar11;
  CommandLineInterface *this_00;
  int iVar12;
  pointer directive;
  long lVar13;
  string value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = this;
  std::__cxx11::string::assign((char *)this);
  arguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  arguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  arguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar10 = (ulong)argc;
  for (lVar13 = 1; lVar13 < (long)uVar10; lVar13 = lVar13 + 1) {
    std::__cxx11::string::string((string *)&name,argv[lVar13],(allocator *)&value);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&arguments,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&name);
    this_00 = (CommandLineInterface *)&name;
    std::__cxx11::string::~string((string *)&name);
  }
  iVar12 = 0;
  while ((ulong)(long)iVar12 <
         (ulong)((long)arguments.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)arguments.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5)) {
    name._M_dataplus._M_p = (pointer)&name.field_2;
    name._M_string_length = 0;
    value._M_dataplus._M_p = (pointer)&value.field_2;
    value._M_string_length = 0;
    name.field_2._M_local_buf[0] = '\0';
    value.field_2._M_local_buf[0] = '\0';
    bVar3 = ParseArgument(this_00,arguments.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[iVar12]._M_dataplus._M_p
                          ,&name,&value);
    if (bVar3) {
      iVar12 = iVar12 + 1;
      if (((long)arguments.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)arguments.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5 != (long)iVar12) &&
         (*arguments.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[iVar12]._M_dataplus._M_p != '-')) {
        std::__cxx11::string::_M_assign((string *)&value);
        goto LAB_0023f5e4;
      }
      poVar6 = std::operator<<((ostream *)&std::cerr,"Missing value for flag: ");
      poVar6 = std::operator<<(poVar6,(string *)&name);
      std::endl<char,std::char_traits<char>>(poVar6);
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &name,"--decode");
      if (bVar3) {
        poVar6 = std::operator<<((ostream *)&std::cerr,
                                 "To decode an unknown message, use --decode_raw.");
        std::endl<char,std::char_traits<char>>(poVar6);
      }
      bVar3 = false;
      uVar10 = 2;
    }
    else {
LAB_0023f5e4:
      PVar5 = InterpretArgument(this,&name,&value);
      bVar3 = PVar5 == PARSE_ARGUMENT_DONE_AND_CONTINUE;
      uVar10 = uVar10 & 0xffffffff;
      if (!bVar3) {
        uVar10 = (ulong)PVar5;
      }
      iVar12 = iVar12 + 1;
    }
    PVar5 = (ParseArgumentStatus)uVar10;
    std::__cxx11::string::~string((string *)&value);
    this_00 = (CommandLineInterface *)&name;
    std::__cxx11::string::~string((string *)&name);
    if (!bVar3) goto LAB_0023f888;
  }
  bVar3 = false;
  for (p_Var8 = (this->plugin_parameters_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var8 != &(this->plugin_parameters_)._M_t._M_impl.super__Rb_tree_header;
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
    __k = p_Var8 + 1;
    iVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(this->plugins_)._M_t,(key_type *)__k);
    if ((_Rb_tree_header *)iVar7._M_node == &(this->plugins_)._M_t._M_impl.super__Rb_tree_header) {
      for (directive = (this->output_directives_).
                       super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          directive !=
          (this->output_directives_).
          super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
          ._M_impl.super__Vector_impl_data._M_finish; directive = directive + 1) {
        if (directive->generator == (CodeGenerator *)0x0) {
          anon_unknown_0::PluginName(&name,&this->plugin_prefix_,&directive->name);
          _Var4 = std::operator==(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)__k);
          std::__cxx11::string::~string((string *)&name);
          if (_Var4) goto LAB_0023f771;
        }
      }
      poVar6 = std::operator<<((ostream *)&std::cerr,"Unknown flag: ");
      std::__cxx11::string::substr((ulong)&local_50,(ulong)__k);
      std::operator+(&value,"--",&local_50);
      std::operator+(&name,&value,"_opt");
      poVar6 = std::operator<<(poVar6,(string *)&name);
      std::endl<char,std::char_traits<char>>(poVar6);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::~string((string *)&value);
      std::__cxx11::string::~string((string *)&local_50);
      bVar3 = true;
    }
LAB_0023f771:
  }
  PVar5 = PARSE_ARGUMENT_FAIL;
  if (bVar3) goto LAB_0023f888;
  if ((this->proto_path_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->proto_path_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[1],_const_char_(&)[2],_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&name,(char (*) [1])0x346eef,(char (*) [2])0x34f683);
    std::
    vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)&this->proto_path_,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&name);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&name);
  }
  pbVar1 = (this->input_files_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->input_files_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->mode_ == MODE_DECODE) && ((this->codec_type_)._M_string_length == 0)) {
    if (pbVar1 == pbVar2) {
LAB_0023f80f:
      if ((this->dependency_out_name_)._M_string_length == 0) {
LAB_0023f8a6:
        sVar9 = (this->descriptor_set_name_)._M_string_length;
        if ((sVar9 == 0 & this->imports_in_descriptor_set_) == 1) {
          poVar6 = std::operator<<((ostream *)&std::cerr,
                                   "--include_imports only makes sense when combined with --descriptor_set_out."
                                  );
          std::endl<char,std::char_traits<char>>(poVar6);
          sVar9 = (this->descriptor_set_name_)._M_string_length;
        }
        PVar5 = PARSE_ARGUMENT_DONE_AND_CONTINUE;
        if ((this->source_info_in_descriptor_set_ == true) && (sVar9 == 0)) {
          poVar6 = std::operator<<((ostream *)&std::cerr,
                                   "--include_source_info only makes sense when combined with --descriptor_set_out."
                                  );
          std::endl<char,std::char_traits<char>>(poVar6);
        }
        goto LAB_0023f888;
      }
      pcVar11 = "Can only use --dependency_out=FILE when generating code.";
    }
    else {
      pcVar11 = "When using --decode_raw, no input files should be given.";
    }
  }
  else if (pbVar1 == pbVar2) {
    pcVar11 = "Missing input file.";
  }
  else {
    if (this->mode_ != MODE_COMPILE) goto LAB_0023f80f;
    if (((this->output_directives_).
         super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (this->output_directives_).
         super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       ((this->descriptor_set_name_)._M_string_length == 0)) {
      pcVar11 = "Missing output directives.";
    }
    else {
      if ((ulong)((long)pbVar2 - (long)pbVar1) < 0x21 ||
          (this->dependency_out_name_)._M_string_length == 0) goto LAB_0023f8a6;
      pcVar11 = "Can only process one input file when using --dependency_out=FILE.";
    }
  }
  poVar6 = std::operator<<((ostream *)&std::cerr,pcVar11);
  std::endl<char,std::char_traits<char>>(poVar6);
LAB_0023f888:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&arguments);
  return PVar5;
}

Assistant:

CommandLineInterface::ParseArgumentStatus
CommandLineInterface::ParseArguments(int argc, const char* const argv[]) {
  executable_name_ = argv[0];

  std::vector<string> arguments;
  for (int i = 1; i < argc; ++i) {
    arguments.push_back(argv[i]);
  }

  // Iterate through all arguments and parse them.
  for (int i = 0; i < arguments.size(); ++i) {
    string name, value;

    if (ParseArgument(arguments[i].c_str(), &name, &value)) {
      // Returned true => Use the next argument as the flag value.
      if (i + 1 == arguments.size() || arguments[i + 1][0] == '-') {
        std::cerr << "Missing value for flag: " << name << std::endl;
        if (name == "--decode") {
          std::cerr << "To decode an unknown message, use --decode_raw."
                    << std::endl;
        }
        return PARSE_ARGUMENT_FAIL;
      } else {
        ++i;
        value = arguments[i];
      }
    }

    ParseArgumentStatus status = InterpretArgument(name, value);
    if (status != PARSE_ARGUMENT_DONE_AND_CONTINUE)
      return status;
  }

  // Make sure each plugin option has a matching plugin output.
  bool foundUnknownPluginOption = false;
  for (std::map<string, string>::const_iterator i = plugin_parameters_.begin();
       i != plugin_parameters_.end(); ++i) {
    if (plugins_.find(i->first) != plugins_.end()) {
      continue;
    }
    bool foundImplicitPlugin = false;
    for (std::vector<OutputDirective>::const_iterator j = output_directives_.begin();
         j != output_directives_.end(); ++j) {
      if (j->generator == NULL) {
        string plugin_name = PluginName(plugin_prefix_ , j->name);
        if (plugin_name == i->first) {
          foundImplicitPlugin = true;
          break;
        }
      }
    }
    if (!foundImplicitPlugin) {
      std::cerr << "Unknown flag: "
                // strip prefix + "gen-" and add back "_opt"
                << "--" + i->first.substr(plugin_prefix_.size() + 4) + "_opt"
                << std::endl;
      foundUnknownPluginOption = true;
    }
  }
  if (foundUnknownPluginOption) {
    return PARSE_ARGUMENT_FAIL;
  }

  // If no --proto_path was given, use the current working directory.
  if (proto_path_.empty()) {
    // Don't use make_pair as the old/default standard library on Solaris
    // doesn't support it without explicit template parameters, which are
    // incompatible with C++0x's make_pair.
    proto_path_.push_back(std::pair<string, string>("", "."));
  }

  // Check some errror cases.
  bool decoding_raw = (mode_ == MODE_DECODE) && codec_type_.empty();
  if (decoding_raw && !input_files_.empty()) {
    std::cerr << "When using --decode_raw, no input files should be given."
              << std::endl;
    return PARSE_ARGUMENT_FAIL;
  } else if (!decoding_raw && input_files_.empty()) {
    std::cerr << "Missing input file." << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (mode_ == MODE_COMPILE && output_directives_.empty() &&
      descriptor_set_name_.empty()) {
    std::cerr << "Missing output directives." << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (mode_ != MODE_COMPILE && !dependency_out_name_.empty()) {
    std::cerr << "Can only use --dependency_out=FILE when generating code."
              << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (!dependency_out_name_.empty() && input_files_.size() > 1) {
    std::cerr
        << "Can only process one input file when using --dependency_out=FILE."
        << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (imports_in_descriptor_set_ && descriptor_set_name_.empty()) {
    std::cerr << "--include_imports only makes sense when combined with "
                 "--descriptor_set_out." << std::endl;
  }
  if (source_info_in_descriptor_set_ && descriptor_set_name_.empty()) {
    std::cerr << "--include_source_info only makes sense when combined with "
                 "--descriptor_set_out." << std::endl;
  }

  return PARSE_ARGUMENT_DONE_AND_CONTINUE;
}